

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall wallet::LegacyDataSPKM::AddWatchOnlyInMem(LegacyDataSPKM *this,CScript *dest)

{
  bool bVar1;
  mapped_type *__dest;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock28;
  CPubKey pubKey;
  unique_lock<std::recursive_mutex> local_80;
  CKeyID local_6d;
  CPubKey local_59;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_80._M_device = &(this->super_FillableSigningProvider).cs_KeyStore.super_recursive_mutex;
  local_80._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_80);
  std::_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
  ::_M_insert_unique<CScript_const&>
            ((_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
              *)&this->setWatchOnly,dest);
  local_59.vch[0] = 0xff;
  bVar1 = ExtractPubKey(dest,&local_59);
  if (bVar1) {
    CPubKey::GetID(&local_6d,&local_59);
    __dest = std::
             map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
             ::operator[](&this->mapWatchKeys,&local_6d);
    memcpy(__dest,&local_59,0x41);
    FillableSigningProvider::ImplicitlyLearnRelatedKeyScripts
              (&this->super_FillableSigningProvider,&local_59);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::AddWatchOnlyInMem(const CScript &dest)
{
    LOCK(cs_KeyStore);
    setWatchOnly.insert(dest);
    CPubKey pubKey;
    if (ExtractPubKey(dest, pubKey)) {
        mapWatchKeys[pubKey.GetID()] = pubKey;
        ImplicitlyLearnRelatedKeyScripts(pubKey);
    }
    return true;
}